

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<const_char_*> __thiscall asl::Array<asl::String>::with<char_const*>(Array<asl::String> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RSI;
  
  Array<const_char_*>::alloc((Array<const_char_*> *)this,*(int *)(*in_RSI + -0x10));
  lVar1 = *in_RSI;
  if (0 < *(int *)(lVar1 + -0x10)) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      if (*(int *)(lVar1 + -8 + lVar2) == 0) {
        lVar1 = lVar1 + lVar2;
      }
      else {
        lVar1 = *(long *)(lVar1 + lVar2);
      }
      *(long *)(&this->_a->_size + lVar3 * 2) = lVar1;
      lVar3 = lVar3 + 1;
      lVar1 = *in_RSI;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < *(int *)(lVar1 + -0x10));
  }
  return (Array<const_char_*>)(char **)this;
}

Assistant:

Array<K> with() const
	{
		Array<K> b(length());
		for (int i = 0; i < length(); i++)
			b[i] = (K)_a[i];
		return b;
	}